

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_depth_bias_representation
          (Impl *this,Value *state,VkDepthBiasRepresentationInfoEXT **out_info)

{
  uint uVar1;
  VkDepthBiasRepresentationEXT VVar2;
  VkDepthBiasRepresentationInfoEXT *pVVar3;
  Type pGVar4;
  VkDepthBiasRepresentationInfoEXT *info;
  VkDepthBiasRepresentationInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkDepthBiasRepresentationInfoEXT>(&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthBiasExact");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->depthBiasExact = uVar1;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthBiasRepresentation");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->depthBiasRepresentation = VVar2;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_depth_bias_representation(const Value &state, VkDepthBiasRepresentationInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkDepthBiasRepresentationInfoEXT>();
	info->depthBiasExact = state["depthBiasExact"].GetUint();
	info->depthBiasRepresentation = static_cast<VkDepthBiasRepresentationEXT>(state["depthBiasRepresentation"].GetUint());
	*out_info = info;
	return true;
}